

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void GC::MarkUsedBlocks(void)

{
  long lVar1;
  long lVar2;
  ExecutorX86 *pEVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  char *basePtr;
  int iVar11;
  int *piVar12;
  uint value;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint frame;
  uint *puVar17;
  ulong uVar18;
  int *piVar19;
  void *unknownExec;
  ExecutorX86 *local_50;
  int local_44;
  int *local_40;
  long local_38;
  
  lVar15 = *(long *)(NULLC::commonLinker + 0x240);
  lVar1 = *(long *)(NULLC::commonLinker + 0x200);
  lVar2 = *(long *)(NULLC::commonLinker + 0x230);
  pvVar6 = DAT_0041f0b0;
  if (DAT_0041f0b0 == (void *)0x0) {
    if (_DAT_0041f0b8 == (long *)0x0) {
      pvVar6 = (void *)(*(code *)NULLC::alloc)(0x2004);
    }
    else {
      pvVar6 = (void *)(**(code **)(*_DAT_0041f0b8 + 0x10))();
    }
    DAT_0041f0b0 = pvVar6;
    memset(pvVar6,0,0x2000);
  }
  _DAT_0041f0a0 = functionIDs;
  _DAT_0041f0a8 = 0xffc;
  if (functionIDs != 0) {
    _DAT_0041f0a8 = 0;
  }
  memset(pvVar6,0,0x2000);
  curr = &rootsA;
  next = &rootsB;
  _DAT_0041f074 = 0;
  _DAT_0041f084 = 0;
  local_50 = (ExecutorX86 *)0x0;
  uVar4 = nullcGetCurrentExecutor(&local_50);
  if (uVar4 != 2) {
    if (*(int *)(NULLC::commonLinker + 0x23c) != 0) {
      puVar17 = (uint *)(lVar2 + 0xc);
      uVar18 = 0;
      do {
        CheckVariable((char *)((ulong)*puVar17 + (long)unmanageableBase),
                      (ExternTypeInfo *)((ulong)puVar17[-1] * 0x50 + lVar1));
        uVar18 = uVar18 + 1;
        puVar17 = puVar17 + 4;
      } while (uVar18 < *(uint *)(NULLC::commonLinker + 0x23c));
    }
    if (uVar4 < 2) {
      uVar13 = *(uint *)(NULLC::commonLinker + 0x750);
      frame = 0;
      piVar19 = (int *)(lVar15 + 8);
      while (uVar4 == 1) {
        uVar5 = ExecutorX86::GetCallStackAddress(local_50,frame);
        pEVar3 = local_50;
        if (uVar5 == 0) {
          puVar8 = (undefined8 *)ExecutorX86::GetStackStart(local_50);
          puVar9 = (undefined8 *)ExecutorX86::GetStackEnd(pEVar3);
          goto LAB_002426fa;
        }
LAB_0024255f:
        for (puVar17 = *(uint **)((long)DAT_0041f0b0 + (ulong)(uVar5 & 0x3ff) * 8);
            puVar17 != (uint *)0x0; puVar17 = *(uint **)(puVar17 + 2)) {
          if (*puVar17 == uVar5) {
            value = puVar17[1];
            goto LAB_002425cf;
          }
        }
        uVar18 = 0xffffffff;
        value = 0xffffffff;
        if ((ulong)*(uint *)(NULLC::commonLinker + 0x24c) != 0) {
          uVar14 = 0;
          piVar12 = piVar19;
          do {
            if ((piVar12[-1] <= (int)uVar5) && ((int)uVar5 < piVar12[-1] + *piVar12)) {
              uVar18 = uVar14 & 0xffffffff;
            }
            value = (uint)uVar18;
            uVar14 = uVar14 + 1;
            piVar12 = piVar12 + 0x25;
          } while (*(uint *)(NULLC::commonLinker + 0x24c) != uVar14);
        }
        HashMap<int>::insert((HashMap<int> *)&functionIDs,uVar5,value);
LAB_002425cf:
        frame = frame + 1;
        if (value != 0xffffffff) {
          lVar7 = (long)(int)value * 0x94;
          lVar2 = lVar15 + lVar7;
          uVar5 = uVar13 + 0xf;
          if (-1 < (int)uVar13) {
            uVar5 = uVar13;
          }
          iVar11 = uVar13 - (uVar5 & 0xfffffff0);
          local_44 = 0x10 - iVar11;
          if (iVar11 == 0) {
            local_44 = 0;
          }
          local_44 = local_44 + uVar13;
          iVar11 = *(int *)(lVar15 + 0x68 + lVar7);
          lVar16 = (long)local_44;
          local_40 = piVar19;
          local_38 = lVar15;
          if (*(int *)(lVar15 + 0x58 + lVar7) != 0) {
            uVar13 = 0;
            do {
              uVar5 = *(int *)(lVar2 + 0x50) + uVar13;
              if (*(uint *)(NULLC::commonLinker + 0x27c) <= uVar5) {
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x7f,
                              "T &FastVector<ExternLocalInfo>::operator[](unsigned int) [T = ExternLocalInfo, zeroNewMemory = false, skipConstructor = false]"
                             );
              }
              lVar15 = (ulong)uVar5 * 0x1c;
              CheckVariable((char *)((long)unmanageableBase +
                                    (ulong)*(uint *)(*(long *)(NULLC::commonLinker + 0x270) + 0xc +
                                                    lVar15) + lVar16),
                            (ExternTypeInfo *)
                            ((ulong)*(uint *)(*(long *)(NULLC::commonLinker + 0x270) + 4 + lVar15) *
                             0x50 + lVar1));
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(uint *)(lVar2 + 0x58));
          }
          if (*(int *)(lVar2 + 0x4c) != -1) {
            CheckPointer((char *)((long)unmanageableBase +
                                 (ulong)*(uint *)(lVar2 + 100) + lVar16 + -8));
          }
          uVar13 = (iVar11 + 0xfU & 0xfffffff0) + local_44;
          lVar15 = local_38;
          piVar19 = local_40;
        }
      }
      uVar5 = ExecutorRegVm::GetCallStackAddress((ExecutorRegVm *)local_50,frame);
      pEVar3 = local_50;
      if (uVar5 != 0) goto LAB_0024255f;
      puVar8 = (undefined8 *)ExecutorRegVm::GetStackStart((ExecutorRegVm *)local_50);
      puVar9 = (undefined8 *)ExecutorRegVm::GetStackEnd((ExecutorRegVm *)pEVar3);
LAB_002426fa:
      if (puVar9 < puVar8) {
        __assert_fail("tempStackTop >= tempStackBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                      ,0x493,"void GC::MarkUsedBlocks()");
      }
      puVar10 = puVar8 + 1;
      while (puVar10 <= puVar9) {
        pvVar6 = (void *)*puVar8;
        if (((void *)0x10000 < pvVar6) &&
           ((pvVar6 < unmanageableBase || (unmanageableTop < pvVar6)))) {
          basePtr = (char *)NULLC::GetBasePointer(pvVar6);
          if ((basePtr != (char *)0x0) && ((*(ulong *)(basePtr + -8) & 3) == 0)) {
            *(ulong *)(basePtr + -8) = *(ulong *)(basePtr + -8) | 1;
            CheckBasePointer(basePtr);
          }
        }
        puVar10 = (undefined8 *)((long)puVar8 + 0xc);
        puVar8 = (undefined8 *)((long)puVar8 + 4);
      }
    }
  }
  MarkPendingRoots();
  return;
}

Assistant:

void GC::MarkUsedBlocks()
{
	GC_DEBUG_PRINT("Unmanageable range: %p-%p\n", GC::unmanageableBase, GC::unmanageableTop);

	// Get information about programs' functions, variables, types and symbols (for debug output)
	ExternFuncInfo	*functions = NULLC::commonLinker->exFunctions.data;
	ExternVarInfo	*vars = NULLC::commonLinker->exVariables.data;
	ExternTypeInfo	*types = NULLC::commonLinker->exTypes.data;
	char			*symbols = NULLC::commonLinker->exSymbols.data;
	(void)symbols;

	GC::functionIDs.init();
	GC::functionIDs.clear();

	GC::curr = &GC::rootsA;
	GC::next = &GC::rootsB;
	GC::curr->clear();
	GC::next->clear();

	// To check every stack frame, we have to get it first. But we have multiple executors, so flow alternates depending on which executor we are running
	void *unknownExec = NULL;
	unsigned int execID = nullcGetCurrentExecutor(&unknownExec);

	if(execID != NULLC_LLVM)
	{
		// Mark global variables
		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(GC::unmanageableBase + vars[i].offset, types[vars[i].type]);
		}
	}
	else
	{
#ifdef NULLC_LLVM_SUPPORT
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;

		unsigned count = 0;
		char *data = exec->GetVariableData(&count);

		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(data + vars[i].offset, types[vars[i].type]);
		}
#endif
	}

	// Starting stack offset is equal to global variable size
	int offset = NULLC::commonLinker->globalVarSize;

	// Init stack trace
	unsigned currentFrame = 0;

	// Mark local variables
	while(true)
	{
		int address = 0;

		// Get next address from call stack

#ifdef NULLC_BUILD_X86_JIT
		if(execID == NULLC_X86)
		{
			ExecutorX86 *exec = (ExecutorX86*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

#ifdef NULLC_LLVM_SUPPORT
		if(execID == NULLC_LLVM)
		{
			ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

		if(execID == NULLC_REG_VM)
		{
			ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}

		// If failed, exit
		if(address == 0)
			break;

		// Find corresponding function
		int *cachedFuncID = GC::functionIDs.find(address);

		int funcID = -1;
		if(cachedFuncID)
		{
			funcID = *cachedFuncID;
		}
		else
		{
			for(unsigned i = 0; i < NULLC::commonLinker->exFunctions.size(); i++)
			{
				if(address >= functions[i].regVmAddress && address < (functions[i].regVmAddress + functions[i].regVmCodeSize))
					funcID = i;
			}

			GC::functionIDs.insert(address, funcID);
		}

		// If we are not in global scope
		if(funcID != -1)
		{
			ExternFuncInfo &function = functions[funcID];

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;
			GC_DEBUG_PRINT("In function %s (with offset of %d)\n", symbols + function.offsetToName, alignOffset);

			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			// Check every function local
			for(unsigned i = 0; i < function.localCount; i++)
			{
				// Get information about local
				ExternLocalInfo &lInfo = NULLC::commonLinker->exLocals[function.offsetToFirstLocal + i];

				GC_DEBUG_PRINT("Local %s %s (with offset of %d+%d)\n", symbols + types[lInfo.type].offsetToName, symbols + lInfo.offsetToName, offset, lInfo.offset);
				// Check it
				GC::CheckVariable(GC::unmanageableBase + offset + lInfo.offset, types[lInfo.type]);
			}

			if(function.contextType != ~0u)
			{
				GC_DEBUG_PRINT("Local %s $context (with offset of %d+%d)\n", symbols + types[function.contextType].offsetToName, offset, function.argumentSize - NULLC_PTR_SIZE);
				char *ptr = GC::unmanageableBase + offset + function.argumentSize - NULLC_PTR_SIZE;
				GC::CheckPointer(ptr);
			}

			offset += stackSize;

			GC_DEBUG_PRINT("Moving offset to next frame by %d bytes\n", stackSize);
		}
	}

	// Check for pointers in stack
	char *tempStackBase = NULL, *tempStackTop = NULL;

#ifdef NULLC_BUILD_X86_JIT
	if(execID == NULLC_X86)
	{
		ExecutorX86 *exec = (ExecutorX86*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

#ifdef NULLC_LLVM_SUPPORT
	if(execID == NULLC_LLVM)
	{
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

	if(execID == NULLC_REG_VM)
	{
		ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}

	GC_DEBUG_PRINT("Check stack from %p to %p\n", tempStackBase, tempStackTop);

	// Check that temporary stack range is correct
	assert(tempStackTop >= tempStackBase);

	// Check temporary stack for pointers
	while(tempStackBase + sizeof(void*) <= tempStackTop)
	{
		char *ptr = GC::ReadVmMemoryPointer(tempStackBase);

		// Check for unmanageable ranges. Range of 0x00000000-0x00010000 is unmanageable by default due to upvalues with offsets inside closures.
		if(ptr > (char*)0x00010000 && (ptr < GC::unmanageableBase || ptr > GC::unmanageableTop))
		{
			// Get pointer base
			unsigned int *basePtr = (unsigned int*)NULLC::GetBasePointer(ptr);
			// If there is no base, this pointer points to memory that is not GCs memory
			if(basePtr)
			{
				GC_DEBUG_PRINT("\tGlobal pointer [stack] %p\n", ptr);

				GC_DEBUG_PRINT("\tPointer base is %p\n", basePtr);

				markerType *marker = (markerType*)((char*)basePtr - sizeof(markerType));

				// Might step on a left-over pointer in stale registers
				if(*marker & OBJECT_FREED)
				{
					tempStackBase += 4;
					continue;
				}

				GC::PrintMarker(*marker);

				// If block is unmarked, mark it as used
				if(!(*marker & OBJECT_VISIBLE))
				{
					*marker |= OBJECT_VISIBLE;

					GC_DEBUG_PRINT("\tMarked as used, checking content\n");

					GC::CheckBasePointer((char*)basePtr);
				}
			}
		}
		tempStackBase += 4;
	}

	GC::MarkPendingRoots();
}